

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSceneObjectTypesFilterInfoMSFT *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  ulong uVar4;
  uint32_t in_stack_fffffffffffffd2c;
  allocator local_2c9;
  GenValidUsageXrInstanceInfo *local_2c8;
  string *local_2c0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_2b8;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2c8 = instance_info;
  local_2c0 = command_name;
  local_2b8 = objects_info;
  if (value->type != XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneObjectTypesFilterInfoMSFT",
               value->type,"VUID-XrSceneObjectTypesFilterInfoMSFT-type-type",
               XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT,
               "XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT");
  }
  if (!check_pnext) goto LAB_0016d9a0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(local_2c8,local_2c0,local_2b8,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2a8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2a8,local_2c8,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string
              ((string *)&local_2a8,"VUID-XrSceneObjectTypesFilterInfoMSFT-next-unique",&local_2c9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Multiple structures of the same type(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct"
               ,&local_2a9);
    CoreValidLogMessage(local_2c8,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2a8);
LAB_0016d969:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSceneObjectTypesFilterInfoMSFT-next-next",
               (allocator *)&local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "Invalid structure(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct \"next\""
               ,&local_2c9);
    CoreValidLogMessage(local_2c8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_0016d969;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0016d9a0:
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  if (value->objectTypeCount == 0) {
    if (value->objectTypes == (XrSceneObjectTypeMSFT *)0x0) {
      return XR_SUCCESS;
    }
  }
  else if (value->objectTypes == (XrSceneObjectTypeMSFT *)0x0) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",(allocator *)&local_288
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,local_2b8);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "Structure XrSceneObjectTypesFilterInfoMSFT member objectTypeCount is NULL, but value->objectTypeCount is greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_2c8,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&error_message);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  uVar4 = 0;
  do {
    if (value->objectTypeCount <= uVar4) {
      return XR_SUCCESS;
    }
    std::__cxx11::string::string
              ((string *)&error_message,"XrSceneObjectTypesFilterInfoMSFT",(allocator *)&local_288);
    std::__cxx11::string::string((string *)&local_2a8,"objectTypes",(allocator *)&valid_ext_structs)
    ;
    bVar1 = ValidateXrEnum(local_2c8,local_2c0,&error_message,&local_2a8,local_2b8,
                           value->objectTypes[uVar4]);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&error_message);
    uVar4 = uVar4 + 1;
  } while (bVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
  std::operator<<((ostream *)&error_message,
                  "XrSceneObjectTypesFilterInfoMSFT contains invalid XrSceneObjectTypeMSFT \"objectTypes\" enum value "
                 );
  Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
  std::operator<<((ostream *)&error_message,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string
            ((string *)&local_2a8,"VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",
             (allocator *)&valid_ext_structs);
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             &local_228,local_2b8);
  std::__cxx11::stringbuf::str();
  CoreValidLogMessage(local_2c8,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2c0,
                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&local_228,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&local_228);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneObjectTypesFilterInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneObjectTypesFilterInfoMSFT",
                             value->type, "VUID-XrSceneObjectTypesFilterInfoMSFT-type-type", XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT, "XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneObjectTypesFilterInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneObjectTypesFilterInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->objectTypeCount is non-zero
    if (0 != value->objectTypeCount && nullptr == value->objectTypes) {
        CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSceneObjectTypesFilterInfoMSFT member objectTypeCount is NULL, but value->objectTypeCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->objectTypes) {
        for (uint32_t value_objecttypes_inc = 0; value_objecttypes_inc < value->objectTypeCount; ++value_objecttypes_inc) {
            // Make sure the enum type XrSceneObjectTypeMSFT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrSceneObjectTypesFilterInfoMSFT", "objectTypes", objects_info, value->objectTypes[value_objecttypes_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrSceneObjectTypesFilterInfoMSFT contains invalid XrSceneObjectTypeMSFT \"objectTypes\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->objectTypes[value_objecttypes_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrSceneObjectTypesFilterInfoMSFT-objectTypes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}